

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_io.hpp
# Opt level: O3

void libtorrent::aux::write_address<std::back_insert_iterator<std::__cxx11::string>>
               (address *a,
               back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *out)

{
  int iVar1;
  uint val;
  long lVar2;
  
  if (a->type_ == ipv6) {
    lVar2 = 0;
    do {
      ::std::__cxx11::string::push_back((char)out->container);
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0x10);
  }
  else if (a->type_ == ipv4) {
    iVar1 = 0x18;
    do {
      ::std::__cxx11::string::push_back((char)out->container);
      iVar1 = iVar1 + -8;
    } while (iVar1 != -8);
  }
  return;
}

Assistant:

void write_address(address const& a, OutIt&& out)
	{
		if (a.is_v4())
		{
			write_uint32(a.to_v4().to_uint(), out);
		}
		else if (a.is_v6())
		{
			for (auto b : a.to_v6().to_bytes())
				write_uint8(b, out);
		}
	}